

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexMatch.cpp
# Opt level: O1

void __thiscall oout::RegexMatch::RegexMatch(RegexMatch *this,string *re)

{
  pointer pcVar1;
  
  (this->super_Match)._vptr_Match = (_func_int **)&PTR__RegexMatch_00199440;
  (this->re)._M_dataplus._M_p = (pointer)&(this->re).field_2;
  pcVar1 = (re->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->re,pcVar1,pcVar1 + re->_M_string_length);
  return;
}

Assistant:

RegexMatch::RegexMatch(const string &re)
	: re(re)
{
}